

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bilinear_pack4.h
# Opt level: O0

void ncnn::resize_bilinear_image_pack4
               (Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 *puVar12;
  int iVar13;
  long in_RCX;
  float *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float *in_R8;
  long in_R9;
  __m128 _D;
  __m128 _rows1_2;
  __m128 _rows0_1;
  int dx_2;
  float *Dp;
  float *rows1p;
  float *rows0p;
  __m128 _b1;
  __m128 _b0;
  __m128 _rows1_1;
  __m128 _rows0;
  __m128 _S11_1;
  __m128 _S10_1;
  __m128 _S01;
  __m128 _S00;
  __m128 _a1_1;
  __m128 _a0_1;
  float *S1p_1;
  float *S0p;
  int sx_1;
  int dx_1;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_1;
  float *S1_1;
  float *S0;
  __m128 _rows1;
  __m128 _S11;
  __m128 _S10;
  __m128 _a1;
  __m128 _a0;
  float *S1p;
  int sx;
  int dx;
  float *rows1p_1;
  float *alphap;
  float *S1;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows1;
  float *rows0;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_fffffffffffff810;
  undefined8 **ppuVar14;
  int in_stack_fffffffffffff81c;
  undefined4 in_stack_fffffffffffff820;
  undefined4 in_stack_fffffffffffff824;
  int in_stack_fffffffffffff82c;
  undefined4 in_stack_fffffffffffff830;
  undefined4 in_stack_fffffffffffff834;
  undefined8 local_798;
  undefined8 uStack_790;
  int local_764;
  undefined8 *local_760;
  undefined8 *local_758;
  undefined8 *local_750;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  int local_694;
  float *local_680;
  undefined8 local_668;
  undefined8 uStack_660;
  int local_604;
  float *local_5f8;
  int local_5d8;
  int local_5d4;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5b0;
  int *local_5a8;
  undefined8 local_5a0;
  undefined4 local_598;
  long *local_590;
  undefined4 local_588;
  undefined4 local_584;
  undefined4 local_580;
  undefined4 local_57c;
  undefined4 local_578;
  undefined8 local_570;
  undefined8 *local_568;
  int *local_560;
  undefined8 local_558;
  undefined4 local_550;
  long *local_548;
  undefined4 local_540;
  undefined4 local_53c;
  undefined4 local_538;
  undefined4 local_534;
  undefined4 local_530;
  undefined8 local_528;
  int local_520;
  int local_51c;
  long local_518;
  float *local_510;
  long local_508;
  float *local_500;
  long *local_4f8;
  long *local_4f0;
  undefined8 **local_4e8;
  undefined8 **local_4d8;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  undefined8 *local_4b8;
  undefined8 *local_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  undefined8 *local_498;
  undefined8 *local_490;
  int local_484;
  long *local_480;
  int local_474;
  long *local_470;
  int local_464;
  long *local_460;
  int local_454;
  long *local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 *local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 *local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 *local_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  int local_138;
  undefined4 local_134;
  undefined8 **local_130;
  int local_118;
  undefined4 local_114;
  undefined8 **local_110;
  undefined8 *local_108;
  undefined8 *local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  undefined8 local_60;
  undefined4 local_54;
  undefined8 local_50;
  int local_44;
  undefined8 **local_40;
  undefined8 local_38;
  undefined4 local_2c;
  undefined8 local_28;
  int local_1c;
  undefined8 **local_18;
  undefined8 **local_10;
  undefined8 **local_8;
  
  local_51c = *(int *)((long)in_RSI + 0x2c);
  local_520 = (int)in_RSI[6];
  local_40 = &local_568;
  local_50 = 0x10;
  local_54 = 4;
  local_60 = 0;
  local_568 = (undefined8 *)0x0;
  local_560 = (int *)0x0;
  local_558 = 0;
  local_550 = 0;
  local_548 = (long *)0x0;
  local_540 = 0;
  local_53c = 0;
  local_538 = 0;
  local_534 = 0;
  local_530 = 0;
  local_528 = 0;
  local_518 = in_R9;
  local_510 = in_R8;
  local_508 = in_RCX;
  local_500 = in_RDX;
  local_4f8 = in_RSI;
  local_4f0 = in_RDI;
  local_44 = local_51c;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
              in_stack_fffffffffffff82c,
              CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
              in_stack_fffffffffffff81c,in_stack_fffffffffffff810);
  local_18 = &local_5b0;
  local_1c = local_51c;
  local_28 = 0x10;
  local_2c = 4;
  local_38 = 0;
  local_5b0 = (undefined8 *)0x0;
  local_5a8 = (int *)0x0;
  local_5a0 = 0;
  local_598 = 0;
  local_590 = (long *)0x0;
  local_588 = 0;
  local_584 = 0;
  local_580 = 0;
  local_57c = 0;
  local_578 = 0;
  local_570 = 0;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
              in_stack_fffffffffffff82c,
              CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
              in_stack_fffffffffffff81c,in_stack_fffffffffffff810);
  local_8 = &local_568;
  local_5c8 = local_568;
  local_10 = &local_5b0;
  local_5d0 = local_5b0;
  local_5d4 = -2;
  for (local_5d8 = 0; puVar12 = local_5c8, local_5d8 < local_520; local_5d8 = local_5d8 + 1) {
    iVar1 = *(int *)(local_518 + (long)local_5d8 * 4);
    if (iVar1 != local_5d4) {
      if (iVar1 == local_5d4 + 1) {
        local_5c8 = local_5d0;
        local_5d0 = puVar12;
        local_464 = iVar1 + 1;
        local_460 = local_4f0;
        lVar4 = *local_4f0;
        iVar2 = *(int *)((long)local_4f0 + 0x2c);
        lVar5 = local_4f0[2];
        local_5f8 = local_500;
        for (local_604 = 0; local_604 < local_51c; local_604 = local_604 + 1) {
          local_490 = (undefined8 *)
                      (lVar4 + (long)iVar2 * (long)local_464 * lVar5 +
                      (long)(*(int *)(local_508 + (long)local_604 * 4) << 2) * 4);
          local_328 = *local_5f8;
          local_2a8 = CONCAT44(local_328,local_328);
          uStack_2a0 = CONCAT44(local_328,local_328);
          local_348 = local_5f8[1];
          local_188 = CONCAT44(local_348,local_348);
          uStack_180 = CONCAT44(local_348,local_348);
          uVar8 = *local_490;
          uVar9 = local_490[1];
          local_498 = local_490 + 2;
          local_178 = *local_498;
          uStack_170 = local_490[3];
          local_298._0_4_ = (float)uVar8;
          local_298._4_4_ = (float)((ulong)uVar8 >> 0x20);
          uStack_290._0_4_ = (float)uVar9;
          uStack_290._4_4_ = (float)((ulong)uVar9 >> 0x20);
          local_668 = CONCAT44(local_298._4_4_ * local_328,(float)local_298 * local_328);
          uStack_660 = CONCAT44(uStack_290._4_4_ * local_328,(float)uStack_290 * local_328);
          local_198 = local_668;
          uStack_190 = uStack_660;
          local_158._0_4_ = (float)local_178;
          local_158._4_4_ = (float)((ulong)local_178 >> 0x20);
          uStack_150._0_4_ = (float)uStack_170;
          uStack_150._4_4_ = (float)((ulong)uStack_170 >> 0x20);
          local_d8._0_4_ = (float)local_158 * local_348;
          local_d8._4_4_ = local_158._4_4_ * local_348;
          local_d8._8_4_ = (float)uStack_150 * local_348;
          local_d8._12_4_ = uStack_150._4_4_ * local_348;
          local_e8 = local_668;
          uStack_e0 = uStack_660;
          local_3e8 = CONCAT44(local_d8._4_4_ + local_298._4_4_ * local_328,
                               local_d8._0_4_ + (float)local_298 * local_328);
          uStack_3e0 = CONCAT44(local_d8._12_4_ + uStack_290._4_4_ * local_328,
                                local_d8._8_4_ + (float)uStack_290 * local_328);
          local_3d0 = (undefined8 *)((long)puVar12 + (long)(local_604 << 2) * 4);
          *local_3d0 = local_3e8;
          local_3d0[1] = uStack_3e0;
          local_5f8 = local_5f8 + 2;
          fStack_344 = local_348;
          fStack_340 = local_348;
          fStack_33c = local_348;
          local_32c = local_348;
          fStack_324 = local_328;
          fStack_320 = local_328;
          fStack_31c = local_328;
          local_30c = local_328;
          local_298 = uVar8;
          uStack_290 = uVar9;
          local_168 = local_188;
          uStack_160 = uStack_180;
          local_158 = local_178;
          uStack_150 = uStack_170;
        }
      }
      else {
        local_470 = local_4f0;
        lVar4 = *local_4f0;
        iVar2 = *(int *)((long)local_4f0 + 0x2c);
        lVar5 = local_4f0[2];
        local_484 = iVar1 + 1;
        local_480 = local_4f0;
        lVar6 = *local_4f0;
        iVar3 = *(int *)((long)local_4f0 + 0x2c);
        lVar7 = local_4f0[2];
        local_680 = local_500;
        for (local_694 = 0; local_474 = iVar1, local_694 < local_51c; local_694 = local_694 + 1) {
          iVar13 = *(int *)(local_508 + (long)local_694 * 4) << 2;
          local_4a0 = (undefined8 *)(lVar4 + (long)iVar2 * (long)iVar1 * lVar5 + (long)iVar13 * 4);
          local_4b0 = (undefined8 *)
                      (lVar6 + (long)iVar3 * (long)local_484 * lVar7 + (long)iVar13 * 4);
          local_368 = *local_680;
          local_2e8 = CONCAT44(local_368,local_368);
          uStack_2e0 = CONCAT44(local_368,local_368);
          local_388 = local_680[1];
          local_228 = CONCAT44(local_388,local_388);
          uStack_220 = CONCAT44(local_388,local_388);
          uVar8 = *local_4a0;
          uVar9 = local_4a0[1];
          local_4a8 = local_4a0 + 2;
          local_1c8 = *local_4a8;
          uStack_1c0 = local_4a0[3];
          uVar10 = *local_4b0;
          uVar11 = local_4b0[1];
          local_4b8 = local_4b0 + 2;
          local_218 = *local_4b8;
          uStack_210 = local_4b0[3];
          local_2b8._0_4_ = (float)uVar8;
          local_2b8._4_4_ = (float)((ulong)uVar8 >> 0x20);
          uStack_2b0._0_4_ = (float)uVar9;
          uStack_2b0._4_4_ = (float)((ulong)uVar9 >> 0x20);
          local_718 = CONCAT44(local_2b8._4_4_ * local_368,(float)local_2b8 * local_368);
          uStack_710 = CONCAT44(uStack_2b0._4_4_ * local_368,(float)uStack_2b0 * local_368);
          local_2d8._0_4_ = (float)uVar10;
          local_2d8._4_4_ = (float)((ulong)uVar10 >> 0x20);
          uStack_2d0._0_4_ = (float)uVar11;
          uStack_2d0._4_4_ = (float)((ulong)uVar11 >> 0x20);
          local_728 = CONCAT44(local_2d8._4_4_ * local_368,(float)local_2d8 * local_368);
          uStack_720 = CONCAT44(uStack_2d0._4_4_ * local_368,(float)uStack_2d0 * local_368);
          local_1e8 = local_718;
          uStack_1e0 = uStack_710;
          local_1a8._0_4_ = (float)local_1c8;
          local_1a8._4_4_ = (float)((ulong)local_1c8 >> 0x20);
          uStack_1a0._0_4_ = (float)uStack_1c0;
          uStack_1a0._4_4_ = (float)((ulong)uStack_1c0 >> 0x20);
          local_b8 = (float)local_1a8 * local_388;
          fStack_b4 = local_1a8._4_4_ * local_388;
          fStack_b0 = (float)uStack_1a0 * local_388;
          fStack_ac = uStack_1a0._4_4_ * local_388;
          local_c8 = local_718;
          uStack_c0 = uStack_710;
          local_408 = CONCAT44(fStack_b4 + local_2b8._4_4_ * local_368,
                               local_b8 + (float)local_2b8 * local_368);
          uStack_400 = CONCAT44(fStack_ac + uStack_2b0._4_4_ * local_368,
                                fStack_b0 + (float)uStack_2b0 * local_368);
          local_238 = local_728;
          uStack_230 = uStack_720;
          local_1f8._0_4_ = (float)local_218;
          local_1f8._4_4_ = (float)((ulong)local_218 >> 0x20);
          uStack_1f0._0_4_ = (float)uStack_210;
          uStack_1f0._4_4_ = (float)((ulong)uStack_210 >> 0x20);
          local_98._0_4_ = (float)local_1f8 * local_388;
          local_98._4_4_ = local_1f8._4_4_ * local_388;
          local_98._8_4_ = (float)uStack_1f0 * local_388;
          local_98._12_4_ = uStack_1f0._4_4_ * local_388;
          local_a8 = local_728;
          uStack_a0 = uStack_720;
          local_428 = CONCAT44(local_98._4_4_ + local_2d8._4_4_ * local_368,
                               local_98._0_4_ + (float)local_2d8 * local_368);
          uStack_420 = CONCAT44(local_98._12_4_ + uStack_2d0._4_4_ * local_368,
                                local_98._8_4_ + (float)uStack_2d0 * local_368);
          local_3f0 = (undefined8 *)((long)local_5c8 + (long)(local_694 << 2) * 4);
          *local_3f0 = local_408;
          local_3f0[1] = uStack_400;
          local_410 = (undefined8 *)((long)local_5d0 + (long)(local_694 << 2) * 4);
          *local_410 = local_428;
          local_410[1] = uStack_420;
          local_680 = local_680 + 2;
          fStack_384 = local_388;
          fStack_380 = local_388;
          fStack_37c = local_388;
          local_36c = local_388;
          fStack_364 = local_368;
          fStack_360 = local_368;
          fStack_35c = local_368;
          local_34c = local_368;
          local_2d8 = uVar10;
          uStack_2d0 = uVar11;
          local_2c8 = local_2e8;
          uStack_2c0 = uStack_2e0;
          local_2b8 = uVar8;
          uStack_2b0 = uVar9;
          local_208 = local_228;
          uStack_200 = uStack_220;
          local_1f8 = local_218;
          uStack_1f0 = uStack_210;
          local_1d8 = local_228;
          uStack_1d0 = uStack_220;
          local_1b8 = local_228;
          uStack_1b0 = uStack_220;
          local_1a8 = local_1c8;
          uStack_1a0 = uStack_1c0;
        }
      }
    }
    local_3a8 = *local_510;
    local_3c8 = local_510[1];
    local_750 = local_5c8;
    local_758 = local_5d0;
    local_450 = local_4f8;
    local_454 = local_5d8;
    local_760 = (undefined8 *)
                (*local_4f8 +
                (long)*(int *)((long)local_4f8 + 0x2c) * (long)local_5d8 * local_4f8[2]);
    for (local_764 = 0; local_764 < local_51c; local_764 = local_764 + 1) {
      local_4c0 = local_750;
      uVar8 = *local_750;
      uVar9 = local_750[1];
      local_4c8 = local_758;
      local_268 = *local_758;
      uStack_260 = local_758[1];
      local_2f8._0_4_ = (float)uVar8;
      local_2f8._4_4_ = (float)((ulong)uVar8 >> 0x20);
      uStack_2f0._0_4_ = (float)uVar9;
      uStack_2f0._4_4_ = (float)((ulong)uVar9 >> 0x20);
      local_798 = CONCAT44(local_2f8._4_4_ * local_3a8,(float)local_2f8 * local_3a8);
      uStack_790 = CONCAT44(uStack_2f0._4_4_ * local_3a8,(float)uStack_2f0 * local_3a8);
      local_288 = local_798;
      uStack_280 = uStack_790;
      local_248._0_4_ = (float)local_268;
      local_248._4_4_ = (float)((ulong)local_268 >> 0x20);
      uStack_240._0_4_ = (float)uStack_260;
      uStack_240._4_4_ = (float)((ulong)uStack_260 >> 0x20);
      local_78._0_4_ = (float)local_248 * local_3c8;
      local_78._4_4_ = local_248._4_4_ * local_3c8;
      local_78._8_4_ = (float)uStack_240 * local_3c8;
      local_78._12_4_ = uStack_240._4_4_ * local_3c8;
      local_88 = local_798;
      uStack_80 = uStack_790;
      local_448 = CONCAT44(local_78._4_4_ + local_2f8._4_4_ * local_3a8,
                           local_78._0_4_ + (float)local_2f8 * local_3a8);
      uStack_440 = CONCAT44(local_78._12_4_ + uStack_2f0._4_4_ * local_3a8,
                            local_78._8_4_ + (float)uStack_2f0 * local_3a8);
      local_430 = local_760;
      *local_760 = local_448;
      local_760[1] = uStack_440;
      local_760 = local_760 + 2;
      local_750 = local_750 + 2;
      local_758 = local_758 + 2;
      local_308 = CONCAT44(local_3a8,local_3a8);
      uStack_300 = CONCAT44(local_3a8,local_3a8);
      local_2f8 = uVar8;
      uStack_2f0 = uVar9;
      local_278 = CONCAT44(local_3c8,local_3c8);
      uStack_270 = CONCAT44(local_3c8,local_3c8);
      local_258 = CONCAT44(local_3c8,local_3c8);
      uStack_250 = CONCAT44(local_3c8,local_3c8);
      local_248 = local_268;
      uStack_240 = uStack_260;
    }
    local_510 = local_510 + 2;
    local_5d4 = iVar1;
    fStack_3c4 = local_3c8;
    fStack_3c0 = local_3c8;
    fStack_3bc = local_3c8;
    local_3ac = local_3c8;
    fStack_3a4 = local_3a8;
    fStack_3a0 = local_3a8;
    fStack_39c = local_3a8;
    local_38c = local_3a8;
  }
  ppuVar14 = &local_5b0;
  local_4e8 = ppuVar14;
  local_110 = ppuVar14;
  if (local_5a8 != (int *)0x0) {
    local_114 = 0xffffffff;
    LOCK();
    local_118 = *local_5a8;
    *local_5a8 = *local_5a8 + -1;
    UNLOCK();
    if (local_118 == 1) {
      if (local_590 == (long *)0x0) {
        local_108 = local_5b0;
        if (local_5b0 != (undefined8 *)0x0) {
          free(local_5b0);
        }
      }
      else {
        (**(code **)(*local_590 + 0x18))(local_590,local_5b0);
      }
    }
  }
  *ppuVar14 = (undefined8 *)0x0;
  ppuVar14[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar14 + 3) = 0;
  *(undefined4 *)(ppuVar14 + 5) = 0;
  *(undefined4 *)((long)ppuVar14 + 0x2c) = 0;
  *(undefined4 *)(ppuVar14 + 6) = 0;
  *(undefined4 *)((long)ppuVar14 + 0x34) = 0;
  *(undefined4 *)(ppuVar14 + 7) = 0;
  ppuVar14[8] = (undefined8 *)0x0;
  ppuVar14[1] = (undefined8 *)0x0;
  local_4d8 = &local_568;
  if (local_560 != (int *)0x0) {
    local_134 = 0xffffffff;
    LOCK();
    local_138 = *local_560;
    *local_560 = *local_560 + -1;
    UNLOCK();
    if (local_138 == 1) {
      local_130 = local_4d8;
      if (local_548 == (long *)0x0) {
        local_f8 = local_568;
        if (local_568 != (undefined8 *)0x0) {
          free(local_568);
        }
      }
      else {
        (**(code **)(*local_548 + 0x18))(local_548,local_568);
      }
    }
  }
  return;
}

Assistant:

static void resize_bilinear_image_pack4(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w, (size_t)4 * 4u, 4);
    Mat rowsbuf1(w, (size_t)4 * 4u, 4);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const float* S1 = src.row(sy + 1);

            const float* alphap = alpha;
            float* rows1p = rows1;
            int dx = 0;
            for (; dx < w; dx++)
            {
                int sx = xofs[dx] * 4;
                const float* S1p = S1 + sx;

                __m128 _a0 = _mm_set1_ps(alphap[0]);
                __m128 _a1 = _mm_set1_ps(alphap[1]);

                __m128 _S10 = _mm_load_ps(S1p);
                __m128 _S11 = _mm_load_ps(S1p + 4);
                __m128 _rows1 = _mm_mul_ps(_S10, _a0);
                _rows1 = _mm_comp_fmadd_ps(_S11, _a1, _rows1);
                _mm_store_ps(rows1p + dx * 4, _rows1);

                alphap += 2;
            }
        }
        else
        {
            // hresize two rows
            const float* S0 = src.row(sy);
            const float* S1 = src.row(sy + 1);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            int dx = 0;
            for (; dx < w; dx++)
            {
                int sx = xofs[dx] * 4;
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;

                __m128 _a0 = _mm_set1_ps(alphap[0]);
                __m128 _a1 = _mm_set1_ps(alphap[1]);

                __m128 _S00 = _mm_load_ps(S0p);
                __m128 _S01 = _mm_load_ps(S0p + 4);
                __m128 _S10 = _mm_load_ps(S1p);
                __m128 _S11 = _mm_load_ps(S1p + 4);
                __m128 _rows0 = _mm_mul_ps(_S00, _a0);
                __m128 _rows1 = _mm_mul_ps(_S10, _a0);
                _rows0 = _mm_comp_fmadd_ps(_S01, _a1, _rows0);
                _rows1 = _mm_comp_fmadd_ps(_S11, _a1, _rows1);
                _mm_store_ps(rows0p + dx * 4, _rows0);
                _mm_store_ps(rows1p + dx * 4, _rows1);

                alphap += 2;
            }
        }

        prev_sy1 = sy;

        // vresize
        __m128 _b0 = _mm_set1_ps(beta[0]);
        __m128 _b1 = _mm_set1_ps(beta[1]);

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* Dp = dst.row(dy);

        for (int dx = 0; dx < w; dx++)
        {
            __m128 _rows0 = _mm_load_ps(rows0p);
            __m128 _rows1 = _mm_load_ps(rows1p);
            __m128 _D = _mm_mul_ps(_rows0, _b0);
            _D = _mm_comp_fmadd_ps(_rows1, _b1, _D);
            _mm_store_ps(Dp, _D);

            Dp += 4;
            rows0p += 4;
            rows1p += 4;
        }

        beta += 2;
    }
}